

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS
ref_iso_triangle_segment
          (REF_DBL *triangle0,REF_DBL *triangle1,REF_DBL *triangle2,REF_DBL *segment0,
          REF_DBL *segment1,REF_DBL *tuvw)

{
  REF_DBL RVar1;
  REF_DBL RVar2;
  REF_DBL RVar3;
  REF_DBL RVar4;
  REF_DBL RVar5;
  double dVar6;
  double local_d0;
  double local_c0;
  double local_b8;
  double local_a8;
  double local_a0;
  double local_90;
  double local_88;
  double local_78;
  double total_volume;
  double side2_volume;
  double side1_volume;
  double side0_volume;
  double bot_volume;
  double top_volume;
  REF_DBL *tuvw_local;
  REF_DBL *segment1_local;
  REF_DBL *segment0_local;
  REF_DBL *triangle2_local;
  REF_DBL *triangle1_local;
  REF_DBL *triangle0_local;
  
  *tuvw = 0.0;
  tuvw[1] = 0.0;
  tuvw[2] = 0.0;
  tuvw[3] = 0.0;
  RVar1 = ref_iso_volume(triangle0,triangle1,triangle2,segment0);
  RVar2 = ref_iso_volume(triangle0,triangle1,triangle2,segment1);
  RVar3 = ref_iso_volume(triangle0,triangle1,segment0,segment1);
  RVar4 = ref_iso_volume(triangle1,triangle2,segment0,segment1);
  RVar5 = ref_iso_volume(triangle2,triangle0,segment0,segment1);
  dVar6 = RVar1 - RVar2;
  if (dVar6 * 1e+20 <= 0.0) {
    local_78 = -(dVar6 * 1e+20);
  }
  else {
    local_78 = dVar6 * 1e+20;
  }
  local_88 = RVar1;
  if (RVar1 <= 0.0) {
    local_88 = -RVar1;
  }
  if (local_88 < local_78) {
    *tuvw = RVar1 / dVar6;
    dVar6 = RVar4 + RVar5 + RVar3;
    if (dVar6 * 1e+20 <= 0.0) {
      local_90 = -(dVar6 * 1e+20);
    }
    else {
      local_90 = dVar6 * 1e+20;
    }
    local_a0 = RVar4;
    if (RVar4 <= 0.0) {
      local_a0 = -RVar4;
    }
    if (local_a0 < local_90) {
      if (dVar6 * 1e+20 <= 0.0) {
        local_a8 = -(dVar6 * 1e+20);
      }
      else {
        local_a8 = dVar6 * 1e+20;
      }
      local_b8 = RVar5;
      if (RVar5 <= 0.0) {
        local_b8 = -RVar5;
      }
      if (local_b8 < local_a8) {
        if (dVar6 * 1e+20 <= 0.0) {
          local_c0 = -(dVar6 * 1e+20);
        }
        else {
          local_c0 = dVar6 * 1e+20;
        }
        local_d0 = RVar3;
        if (RVar3 <= 0.0) {
          local_d0 = -RVar3;
        }
        if (local_d0 < local_c0) {
          tuvw[1] = RVar4 / dVar6;
          tuvw[2] = RVar5 / dVar6;
          tuvw[3] = RVar3 / dVar6;
          return 0;
        }
      }
    }
  }
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_iso_triangle_segment(REF_DBL *triangle0,
                                            REF_DBL *triangle1,
                                            REF_DBL *triangle2,
                                            REF_DBL *segment0,
                                            REF_DBL *segment1, REF_DBL *tuvw) {
  double top_volume, bot_volume;
  double side0_volume, side1_volume, side2_volume;
  double total_volume;

  tuvw[0] = 0.0;
  tuvw[1] = 0.0;
  tuvw[2] = 0.0;
  tuvw[3] = 0.0;

  /* is segment in triangle plane? */
  top_volume = ref_iso_volume(triangle0, triangle1, triangle2, segment0);
  bot_volume = ref_iso_volume(triangle0, triangle1, triangle2, segment1);

  /* does segment pass through triangle? */
  side2_volume = ref_iso_volume(triangle0, triangle1, segment0, segment1);
  side0_volume = ref_iso_volume(triangle1, triangle2, segment0, segment1);
  side1_volume = ref_iso_volume(triangle2, triangle0, segment0, segment1);

  total_volume = top_volume - bot_volume;
  if (ref_math_divisible(top_volume, total_volume)) {
    tuvw[0] = top_volume / total_volume;
  } else {
    return REF_DIV_ZERO;
  }

  total_volume = side0_volume + side1_volume + side2_volume;
  if (ref_math_divisible(side0_volume, total_volume) &&
      ref_math_divisible(side1_volume, total_volume) &&
      ref_math_divisible(side2_volume, total_volume)) {
    tuvw[1] = side0_volume / total_volume;
    tuvw[2] = side1_volume / total_volume;
    tuvw[3] = side2_volume / total_volume;
  } else {
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}